

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O3

CompileMessage * __thiscall
soul::CompileMessageHelpers::createMessage<std::__cxx11::string&>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          Type type,char *text,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  SourceCodeText *o;
  
  o = (SourceCodeText *)0x0;
  createMessage<std::__cxx11::string&>
            (__return_storage_ptr__,this,(Category)&stack0xffffffffffffffe8,
             (CodeLocation *)(ulong)category,type,text,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CompileMessage::Type type,
                                         const char* text, Args&&... args)
    {
        return createMessage (category, CodeLocation(), type, text, std::forward<Args> (args)...);
    }